

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall Jinx::Impl::Parser::IsSymbolValid(Parser *this,SymbolListCItr symbol)

{
  if ((this->m_error == false) &&
     ((this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish != symbol._M_current)) {
    return (symbol._M_current)->type != NewLine;
  }
  return false;
}

Assistant:

inline_t bool Parser::IsSymbolValid(SymbolListCItr symbol) const
	{
		if (m_error)
			return false;
		if (symbol == m_symbolList.end())
			return false;
		if (symbol->type == SymbolType::NewLine)
			return false;
		return true;
	}